

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

Promise<void> kj::joinPromisesFailFast(Array<kj::Promise<void>_> *promises,SourceLocation location)

{
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  ExceptionOr<kj::_::Void> *pEVar4;
  Promise<void> *pPVar5;
  long lVar6;
  long lVar7;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar8;
  long *in_RSI;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_68;
  ArrayJoinBehavior local_4c;
  Array<kj::_::ExceptionOr<kj::_::Void>_> local_48;
  Promise<void> *local_28;
  
  local_68.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)
                 _::HeapArrayDisposer::allocateImpl
                           (8,0,in_RSI[1],(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_48.size_ = in_RSI[1];
  pOVar8 = local_68.ptr;
  if (local_48.size_ != 0) {
    lVar1 = *in_RSI;
    lVar6 = 0;
    do {
      lVar7 = lVar6;
      uVar2 = *(undefined8 *)(lVar1 + lVar7);
      *(undefined8 *)(lVar1 + lVar7) = 0;
      *(undefined8 *)((long)&(local_68.ptr)->ptr + lVar7) = uVar2;
      lVar6 = lVar7 + 8;
    } while (local_48.size_ * 8 - (lVar7 + 8) != 0);
    pOVar8 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)&local_68.ptr[1].ptr + lVar7)
    ;
  }
  local_68.size_ = (long)pOVar8 - (long)local_68.ptr >> 3;
  local_68.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_48.ptr = (ExceptionOr<kj::_::Void> *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x1a0,local_48.size_,local_48.size_,
                            _::HeapArrayDisposer::Allocate_<kj::_::ExceptionOr<kj::_::Void>_>::
                            construct,
                            ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>_>::destruct);
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_4c = EAGER;
  _::PromiseDisposer::
  alloc<kj::_::ArrayJoinPromiseNode<void>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((PromiseDisposer *)&local_28,&local_68,&local_48,&location,&local_4c);
  pPVar5 = local_28;
  sVar3 = local_48.size_;
  pEVar4 = local_48.ptr;
  local_28 = (Promise<void> *)0x0;
  promises->ptr = pPVar5;
  if (local_48.ptr != (ExceptionOr<kj::_::Void> *)0x0) {
    local_48.ptr = (ExceptionOr<kj::_::Void> *)0x0;
    local_48.size_ = 0;
    (*(code *)**(undefined8 **)local_48.disposer)
              (local_48.disposer,pEVar4,0x1a0,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<kj::_::Void>_>::destruct);
  }
  sVar3 = local_68.size_;
  pOVar8 = local_68.ptr;
  if (local_68.ptr != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    local_68.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    local_68.size_ = 0;
    (*(code *)**(undefined8 **)local_68.disposer)
              (local_68.disposer,pOVar8,8,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
  }
  return (PromiseBase)(PromiseBase)promises;
}

Assistant:

Promise<void> joinPromisesFailFast(Array<Promise<void>>&& promises, SourceLocation location) {
  return _::PromiseNode::to<Promise<void>>(_::allocPromise<_::ArrayJoinPromiseNode<void>>(
      KJ_MAP(p, promises) { return _::PromiseNode::from(kj::mv(p)); },
      heapArray<_::ExceptionOr<_::Void>>(promises.size()), location,
      _::ArrayJoinBehavior::EAGER));
}